

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

void xmlXIncludeMergeEntity(void *payload,void *vdata,xmlChar *name)

{
  xmlDoc *doc;
  xmlXIncludeCtxtPtr ctxt;
  int iVar1;
  xmlEntityPtr pxVar2;
  xmlChar *pxVar3;
  xmlEntityType xVar4;
  xmlChar *str2;
  
  if (vdata != (void *)0x0 && payload != (void *)0x0) {
    doc = *vdata;
    ctxt = *(xmlXIncludeCtxtPtr *)((long)vdata + 8);
    if ((doc != (xmlDoc *)0x0 && ctxt != (xmlXIncludeCtxtPtr)0x0) &&
       (2 < *(int *)((long)payload + 0x5c) - 4U)) {
      pxVar2 = xmlGetDocEntity(doc,*(xmlChar **)((long)payload + 0x10));
      if (pxVar2 == (xmlEntityPtr)0x0) {
        pxVar2 = xmlAddDocEntity(doc,*(xmlChar **)((long)payload + 0x10),
                                 *(int *)((long)payload + 0x5c),*(xmlChar **)((long)payload + 0x60),
                                 *(xmlChar **)((long)payload + 0x68),
                                 *(xmlChar **)((long)payload + 0x50));
        if (pxVar2 == (xmlEntityPtr)0x0) {
LAB_001bbb13:
          xmlXIncludeErrMemory(ctxt);
          return;
        }
        if (*(xmlChar **)((long)payload + 0x78) != (xmlChar *)0x0) {
          pxVar3 = xmlStrdup(*(xmlChar **)((long)payload + 0x78));
          pxVar2->URI = pxVar3;
          if (pxVar3 == (xmlChar *)0x0) goto LAB_001bbb13;
        }
      }
      else {
        xVar4 = *(xmlEntityType *)((long)payload + 0x5c);
        if (xVar4 == pxVar2->etype) {
          pxVar3 = *(xmlChar **)((long)payload + 0x68);
          if (((((pxVar3 != (xmlChar *)0x0) && (str2 = pxVar2->SystemID, str2 != (xmlChar *)0x0)) ||
               ((pxVar3 = *(xmlChar **)((long)payload + 0x60), pxVar3 != (xmlChar *)0x0 &&
                (str2 = pxVar2->ExternalID, str2 != (xmlChar *)0x0)))) ||
              ((pxVar3 = *(xmlChar **)((long)payload + 0x50), pxVar3 != (xmlChar *)0x0 &&
               (str2 = pxVar2->content, str2 != (xmlChar *)0x0)))) &&
             (iVar1 = xmlStrEqual(pxVar3,str2), iVar1 != 0)) {
            return;
          }
          xVar4 = *(xmlEntityType *)((long)payload + 0x5c);
        }
        if ((XML_INTERNAL_PREDEFINED_ENTITY < xVar4) || ((0x76U >> (xVar4 & 0x1f) & 1) == 0)) {
          xmlXIncludeErr(ctxt,(xmlNodePtr)payload,0x642,"mismatch in redefinition of entity %s\n",
                         *(xmlChar **)((long)payload + 0x10));
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlXIncludeMergeEntity(void *payload, void *vdata,
	               const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlEntityPtr ent = (xmlEntityPtr) payload;
    xmlXIncludeMergeDataPtr data = (xmlXIncludeMergeDataPtr) vdata;
    xmlEntityPtr ret, prev;
    xmlDocPtr doc;
    xmlXIncludeCtxtPtr ctxt;

    if ((ent == NULL) || (data == NULL))
	return;
    ctxt = data->ctxt;
    doc = data->doc;
    if ((ctxt == NULL) || (doc == NULL))
	return;
    switch (ent->etype) {
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
        case XML_INTERNAL_PREDEFINED_ENTITY:
	    return;
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
	    break;
    }
    prev = xmlGetDocEntity(doc, ent->name);
    if (prev == NULL) {
        ret = xmlAddDocEntity(doc, ent->name, ent->etype, ent->ExternalID,
                              ent->SystemID, ent->content);
        if (ret == NULL) {
            xmlXIncludeErrMemory(ctxt);
            return;
        }
	if (ent->URI != NULL) {
	    ret->URI = xmlStrdup(ent->URI);
            if (ret->URI == 0)
                xmlXIncludeErrMemory(ctxt);
        }
    } else {
        if (ent->etype != prev->etype)
            goto error;

        if ((ent->SystemID != NULL) && (prev->SystemID != NULL)) {
            if (!xmlStrEqual(ent->SystemID, prev->SystemID))
                goto error;
        } else if ((ent->ExternalID != NULL) &&
                   (prev->ExternalID != NULL)) {
            if (!xmlStrEqual(ent->ExternalID, prev->ExternalID))
                goto error;
        } else if ((ent->content != NULL) && (prev->content != NULL)) {
            if (!xmlStrEqual(ent->content, prev->content))
                goto error;
        } else {
            goto error;
        }
    }
    return;
error:
    switch (ent->etype) {
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
        case XML_INTERNAL_PREDEFINED_ENTITY:
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
	    return;
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
	    break;
    }
    xmlXIncludeErr(ctxt, (xmlNodePtr) ent, XML_XINCLUDE_ENTITY_DEF_MISMATCH,
                   "mismatch in redefinition of entity %s\n",
		   ent->name);
}